

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AArch64Mapping.c
# Opt level: O2

char * AArch64_insn_name(csh handle,uint id)

{
  long lVar1;
  char **ppcVar2;
  long lVar3;
  
  if (0x1c3 < id) {
    return (char *)0x0;
  }
  if (id < 0x1a1) {
    ppcVar2 = &insn_name_maps[id].name;
  }
  else {
    lVar1 = 0;
    do {
      lVar3 = lVar1;
      if (lVar3 + 0x10 == 0x2c0) {
        return (char *)0x0;
      }
      lVar1 = lVar3 + 0x10;
    } while (*(uint *)((long)&alias_insn_name_maps[0].id + lVar3) != id);
    ppcVar2 = (char **)((long)&alias_insn_name_maps[0].name + lVar3);
  }
  return *ppcVar2;
}

Assistant:

const char *AArch64_insn_name(csh handle, unsigned int id)
{
#ifndef CAPSTONE_DIET
	unsigned int i;

	if (id >= ARM64_INS_ENDING)
		return NULL;

	if (id < ARR_SIZE(insn_name_maps))
		return insn_name_maps[id].name;

	// then find alias insn
	for (i = 0; i < ARR_SIZE(alias_insn_name_maps); i++) {
		if (alias_insn_name_maps[i].id == id)
			return alias_insn_name_maps[i].name;
	}

	// not found
	return NULL;
#else
	return NULL;
#endif
}